

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_differencer.cc
# Opt level: O0

void __thiscall
google::protobuf::util::MessageDifferencer::StreamReporter::ReportIgnored
          (StreamReporter *this,Message *param_1,Message *param_2,
          vector<google::protobuf::util::MessageDifferencer::SpecificField,_std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>_>
          *field_path)

{
  Printer *pPVar1;
  bool bVar2;
  string_view local_58;
  string_view local_48;
  string_view local_38;
  vector<google::protobuf::util::MessageDifferencer::SpecificField,_std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>_>
  *local_28;
  vector<google::protobuf::util::MessageDifferencer::SpecificField,_std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>_>
  *field_path_local;
  Message *param_2_local;
  Message *param_1_local;
  StreamReporter *this_local;
  
  pPVar1 = this->printer_;
  local_28 = field_path;
  field_path_local =
       (vector<google::protobuf::util::MessageDifferencer::SpecificField,_std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>_>
        *)param_2;
  param_2_local = param_1;
  param_1_local = (Message *)this;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_38,"ignored: ");
  io::Printer::Print<>(pPVar1,local_38);
  (*(this->super_Reporter)._vptr_Reporter[9])(this,local_28,1);
  bVar2 = CheckPathChanged(local_28);
  if (bVar2) {
    pPVar1 = this->printer_;
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_48," -> ");
    io::Printer::Print<>(pPVar1,local_48);
    (*(this->super_Reporter)._vptr_Reporter[9])(this,local_28,0);
  }
  pPVar1 = this->printer_;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_58,"\n");
  io::Printer::Print<>(pPVar1,local_58);
  return;
}

Assistant:

void MessageDifferencer::StreamReporter::ReportIgnored(
    const Message& /*message1*/, const Message& /*message2*/,
    const std::vector<SpecificField>& field_path) {
  printer_->Print("ignored: ");
  PrintPath(field_path, true);
  if (CheckPathChanged(field_path)) {
    printer_->Print(" -> ");
    PrintPath(field_path, false);
  }
  printer_->Print("\n");  // Print for newlines.
}